

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

opj_bool jp2_get_tile(opj_jp2_v2_t *jp2,opj_stream_private_t *p_stream,opj_image_t *p_image,
                     opj_event_mgr *p_manager,OPJ_UINT32 tile_index)

{
  opj_event_mgr_t *in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  OPJ_UINT32 tile_index_00;
  opj_event_mgr *in_RDI;
  opj_stream_private_t *unaff_retaddr;
  undefined4 in_stack_00000008;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  opj_bool oVar1;
  
  tile_index_00 = (OPJ_UINT32)((ulong)in_RSI >> 0x20);
  if (in_RDX == 0) {
    oVar1 = 0;
  }
  else {
    opj_event_msg_v2(in_RCX,2,
                     "JP2 box which are after the codestream will not be read by this function.\n");
    oVar1 = j2k_get_tile((opj_j2k_v2_t *)CONCAT44(tile_index,in_stack_00000008),unaff_retaddr,
                         (opj_image_t *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                         tile_index_00);
    if (oVar1 == 0) {
      opj_event_msg_v2(in_RCX,1,"Failed to decode the codestream in the JP2 file\n");
      oVar1 = 0;
    }
    else {
      if (*(int *)((long)&in_RDI[1].info_handler + 4) == 0x10) {
        *(undefined4 *)(in_RDX + 0x14) = 1;
      }
      else if (*(int *)((long)&in_RDI[1].info_handler + 4) == 0x11) {
        *(undefined4 *)(in_RDX + 0x14) = 2;
      }
      else if (*(int *)((long)&in_RDI[1].info_handler + 4) == 0x12) {
        *(undefined4 *)(in_RDX + 0x14) = 3;
      }
      else {
        *(undefined4 *)(in_RDX + 0x14) = 0xffffffff;
      }
      if (in_RDI[4].client_data != (void *)0x0) {
        jp2_apply_cdef((opj_image_t *)p_stream,(opj_jp2_color_t *)p_image);
      }
      if (in_RDI[4].error_handler != (opj_msg_callback)0x0) {
        if (*(long *)(in_RDI[4].error_handler + 0x18) == 0) {
          jp2_free_pclr((opj_jp2_color_t *)0x2be622);
        }
        else {
          jp2_apply_pclr((opj_image_t *)p_stream,(opj_jp2_color_t *)p_image);
        }
      }
      if (in_RDI[3].warning_handler != (opj_msg_callback)0x0) {
        *(opj_msg_callback *)(in_RDX + 0x20) = in_RDI[3].warning_handler;
        *(undefined4 *)(in_RDX + 0x28) = *(undefined4 *)&in_RDI[3].info_handler;
        in_RDI[3].warning_handler = (opj_msg_callback)0x0;
      }
      oVar1 = 1;
    }
  }
  return oVar1;
}

Assistant:

opj_bool jp2_get_tile(	opj_jp2_v2_t *jp2,
						opj_stream_private_t *p_stream,
						opj_image_t* p_image,
						struct opj_event_mgr * p_manager,
						OPJ_UINT32 tile_index )
{
	if (!p_image)
		return OPJ_FALSE;

	opj_event_msg_v2(p_manager, EVT_WARNING, "JP2 box which are after the codestream will not be read by this function.\n");

	if (! j2k_get_tile(jp2->j2k, p_stream, p_image, p_manager, tile_index) ){
		opj_event_msg_v2(p_manager, EVT_ERROR, "Failed to decode the codestream in the JP2 file\n");
		return OPJ_FALSE;
	}

	/* Set Image Color Space */
	if (jp2->enumcs == 16)
		p_image->color_space = CLRSPC_SRGB;
	else if (jp2->enumcs == 17)
		p_image->color_space = CLRSPC_GRAY;
	else if (jp2->enumcs == 18)
		p_image->color_space = CLRSPC_SYCC;
	else
		p_image->color_space = CLRSPC_UNKNOWN;

	/* Apply the color space if needed */
	if(jp2->color.jp2_cdef) {
		jp2_apply_cdef(p_image, &(jp2->color));
	}

	if(jp2->color.jp2_pclr) {
		/* Part 1, I.5.3.4: Either both or none : */
		if( !jp2->color.jp2_pclr->cmap)
			jp2_free_pclr(&(jp2->color));
		else
			jp2_apply_pclr(p_image, &(jp2->color));
	}

	if(jp2->color.icc_profile_buf) {
		p_image->icc_profile_buf = jp2->color.icc_profile_buf;
		p_image->icc_profile_len = jp2->color.icc_profile_len;
		jp2->color.icc_profile_buf = NULL;
	}

	return OPJ_TRUE;
}